

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O3

bool __thiscall Omega_h::InputScalar::as(InputScalar *this,bool *out)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)&this->str);
  bVar2 = true;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)&this->str);
    bVar2 = false;
    if (iVar1 != 0) {
      return false;
    }
  }
  *out = bVar2;
  return true;
}

Assistant:

bool InputScalar::as(bool& out) const {
  if (str == "true") {
    out = true;
    return true;
  }
  if (str == "false") {
    out = false;
    return true;
  }
  return false;
}